

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s1;
  char cVar1;
  int iVar2;
  size_type __n;
  char *filename;
  char *pcVar3;
  int iVar4;
  bool bVar5;
  string input_text;
  vector<unsigned_long,_std::allocator<unsigned_long>_> binary;
  ofstream outfp;
  allocator<char> local_271;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_250;
  undefined1 local_238 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228 [14];
  ios_base local_140 [272];
  
  if (argc < 2) {
    pcVar3 = (char *)0x0;
    filename = (char *)0x0;
  }
  else {
    iVar4 = 1;
    filename = (char *)0x0;
    pcVar3 = (char *)0x0;
    do {
      __s1 = argv[iVar4];
      iVar2 = strcmp(__s1,"-o");
      if (iVar2 == 0) {
        if (pcVar3 != (char *)0x0) {
          pcVar3 = "command line output file already provided";
          goto LAB_0011d7cf;
        }
        iVar4 = iVar4 + 1;
        if (iVar4 == argc) {
          pcVar3 = "expected command line syntax: \"-o\" <output file>";
          goto LAB_0011d7cf;
        }
        pcVar3 = argv[iVar4];
      }
      else {
        bVar5 = filename != (char *)0x0;
        filename = __s1;
        if (bVar5) {
          pcVar3 = "command line input file already provided";
          goto LAB_0011d7cf;
        }
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 < argc);
  }
  if (filename == (char *)0x0) {
    pcVar3 = "no input file";
  }
  else {
    if (pcVar3 != (char *)0x0) {
      std::ifstream::ifstream(local_238,filename,_S_bin);
      cVar1 = std::__basic_file<char>::is_open();
      if (cVar1 == '\0') {
        fatal_error((char *)0x0,"%s: failed to open",filename);
      }
      std::istream::seekg((long)local_238,_S_beg);
      __n = std::istream::tellg();
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
                (&local_270,__n,' ');
      std::istream::seekg((long)local_238,_S_beg);
      std::istream::read(local_238,(long)local_270._M_dataplus._M_p);
      std::ifstream::~ifstream(local_238);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_238,local_270._M_dataplus._M_p,&local_271);
      nxas::assemble(&local_250,(string *)local_238,filename);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._0_8_ != local_228) {
        operator_delete((void *)local_238._0_8_,local_228[0]._M_allocated_capacity + 1);
      }
      std::ofstream::ofstream(local_238,pcVar3,_S_bin);
      cVar1 = std::__basic_file<char>::is_open();
      if (cVar1 == '\0') {
        fatal_error("%s: failed to open",pcVar3);
      }
      std::ostream::write(local_238,
                          (long)local_250.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
      local_238._0_8_ = _VTT;
      *(undefined8 *)(local_238 + *(long *)(_VTT + -0x18)) = __filebuf;
      std::filebuf::~filebuf((filebuf *)(local_238 + 8));
      std::ios_base::~ios_base(local_140);
      if (local_250.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_250.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_250.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_250.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      }
      return 0;
    }
    pcVar3 = "no output file";
  }
LAB_0011d7cf:
  fatal_error(pcVar3);
}

Assistant:

int main(int argc, char** argv)
{
    const char* input_file = nullptr;
    const char* output_file = nullptr;

    for (int i = 1; i < argc; ++i) {
        // Parse output file
        if (std::strcmp(argv[i], "-o") == 0) {
            if (output_file) {
                fatal_error("command line output file already provided");
            }
            if (++i == argc) {
                fatal_error("expected command line syntax: \"-o\" <output file>");
            }
            output_file = argv[i];
            continue;
        }
        // There's no modifier, it's an input file
        if (input_file) {
            fatal_error("command line input file already provided");
        }
        input_file = argv[i];
    }
    if (!input_file) {
        fatal_error("no input file");
    }
    if (!output_file) {
        fatal_error("no output file");
    }
    const std::string input_text = read_file(input_file);
    const std::vector<uint64_t> binary = nxas::assemble(input_text.c_str(), input_file);
    try {
        std::ofstream outfp(output_file, std::ios::binary);
        if (!outfp.is_open()) {
            fatal_error("%s: failed to open", output_file);
        }
        outfp.write(reinterpret_cast<const char*>(binary.data()), binary.size() * sizeof(uint64_t));
    } catch (const std::ios_base::failure& e) {
        fatal_error("failed to write output file: %s", e.what());
    }
}